

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

void objutadv(objucxdef *undoctx)

{
  undefined1 *puVar1;
  short sVar2;
  int iVar3;
  long in_RDI;
  uchar cmd;
  uchar pr [6];
  ushort siz;
  uchar *p;
  undefined4 local_18;
  undefined2 local_14;
  short local_12;
  undefined1 *local_10;
  long local_8;
  
  if (*(short *)(in_RDI + 0x14) == *(short *)(in_RDI + 0x16)) {
    *(undefined2 *)(in_RDI + 0x14) = 0;
    *(undefined2 *)(in_RDI + 0x16) = 0;
    *(undefined2 *)(in_RDI + 0x12) = 0;
    *(undefined2 *)(in_RDI + 0x18) = 0;
  }
  if (*(short *)(in_RDI + 0x14) == *(short *)(in_RDI + 0x18)) {
    *(undefined2 *)(in_RDI + 0x14) = 0;
  }
  else {
    puVar1 = (undefined1 *)(in_RDI + 0x38 + (ulong)*(ushort *)(in_RDI + 0x14));
    local_12 = 3;
    local_10 = puVar1 + 3;
    local_8 = in_RDI;
    switch(*puVar1) {
    case 2:
      local_18 = *(undefined4 *)(puVar1 + 7);
      local_14 = *(undefined2 *)(puVar1 + 0xb);
      iVar3 = osrp2((void *)((long)&local_18 + 3));
      local_12 = local_12 + (short)iVar3 + 6;
    case 1:
    case 4:
      local_12 = local_12 + 4;
      break;
    case 3:
      break;
    case 5:
      sVar2 = (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x30),local_10);
      local_12 = local_12 + sVar2;
    }
    *(short *)(local_8 + 0x14) = *(short *)(local_8 + 0x14) + local_12;
  }
  return;
}

Assistant:

void objutadv(objucxdef *undoctx)
{
    uchar  *p;
    ushort  siz;
    uchar   pr[PRPHDRSIZ];                   /* space for a property header */
    uchar   cmd;
    
    /* if we're at the most recently written record, flush buffer */
    if (undoctx->objucxtail == undoctx->objucxprv)
    {
        undoctx->objucxtail = 0;
        undoctx->objucxprv = 0;
        undoctx->objucxhead = 0;
        undoctx->objucxtop = 0;
    }

    /* if we've reached high water mark, wrap back to bottom */
    if (undoctx->objucxtail == undoctx->objucxtop)
    {
        undoctx->objucxtail = 0;
        return;
    }
    
    /* determine size by inspecting current record */
    p = undoctx->objucxbuf + undoctx->objucxtail;
    siz = 1 + sizeof(ushort);                          /* basic header size */
    
    cmd = *p++;
    p += sizeof(ushort);                       /* skip the previous pointer */
    
    switch(cmd)
    {
    case OBJUCHG:
        /* change:  property header (added below) plus data value */
        memcpy(pr, p + sizeof(mcmon) + sizeof(prpnum), (size_t)PRPHDRSIZ);
        siz += PRPHDRSIZ + prpsize(pr);
        /* FALLTHROUGH */

    case OBJUADD:
    case OBJUOVR:
        /* add/override:  property header only */
        siz += sizeof(mcmon) + sizeof(prpnum);
        break;
        
    case OBJUCLI:
        siz += (*undoctx->objucxcsz)(undoctx->objucxccx, p);
        break;

    case OBJUSAV:
        break;
    }
    
    undoctx->objucxtail += siz;
}